

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O1

void __thiscall summarycalc::summarycalc(summarycalc *this)

{
  _Rb_tree_header *p_Var1;
  
  this->min_summary_id_[4] = 0x7fffffff;
  this->min_summary_id_[5] = 0x7fffffff;
  this->min_summary_id_[6] = 0x7fffffff;
  this->min_summary_id_[7] = 0x7fffffff;
  this->min_summary_id_[0] = 0x7fffffff;
  this->min_summary_id_[1] = 0x7fffffff;
  this->min_summary_id_[2] = 0x7fffffff;
  this->min_summary_id_[3] = 0x7fffffff;
  this->min_summary_id_[8] = 0x7fffffff;
  this->min_summary_id_[9] = 0x7fffffff;
  this->max_summary_id_[0] = -1;
  this->max_summary_id_[1] = -1;
  this->max_summary_id_[2] = -1;
  this->max_summary_id_[3] = -1;
  this->max_summary_id_[4] = -1;
  this->max_summary_id_[5] = -1;
  this->max_summary_id_[6] = -1;
  this->max_summary_id_[7] = -1;
  this->max_summary_id_[8] = -1;
  this->max_summary_id_[9] = -1;
  memset(this->fout,0,500);
  (this->inputpath_)._M_dataplus._M_p = (pointer)&(this->inputpath_).field_2;
  (this->inputpath_)._M_string_length = 0;
  (this->inputpath_).field_2._M_local_buf[0] = '\0';
  this->zerooutput_ = false;
  p_Var1 = &(this->indexFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->indexFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->indexFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->indexFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->indexFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  *(undefined1 (*) [16])&(this->indexFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  this->offset_[1] = 0;
  this->offset_[2] = 0;
  this->offset_[3] = 0;
  this->offset_[4] = 0;
  this->offset_[5] = 0;
  this->offset_[6] = 0;
  this->offset_[7] = 0;
  this->offset_[8] = 0;
  this->offset_[9] = 0;
  this->num_idx_ = 5;
  this->first_idx_ = 2;
  this->last_event_id_ = -1;
  this->last_item_id_ = -1;
  freopen((char *)0x0,"rb",_stdin);
  freopen((char *)0x0,"wb",_stdout);
  return;
}

Assistant:

summarycalc::summarycalc()
{

#if defined(_MSC_VER) || defined(__MINGW32__)
	_setmode(_fileno(stdout), O_BINARY);
	_setmode(_fileno(stdin), O_BINARY);
#else
	freopen(NULL, "rb", stdin);
	freopen(NULL, "wb", stdout);
#endif

}